

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
* __thiscall
wasm::StackIROptimizer::findStringViewDeferredGets
          (unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
           *__return_storage_ptr__,StackIROptimizer *this)

{
  vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_> *this_00;
  StackInst *pSVar1;
  bool bVar2;
  reference ppSVar3;
  StringWTF16Get *pSVar4;
  StringSliceWTF *pSVar5;
  StringSliceWTF *curr_1;
  StringWTF16Get *curr;
  StackInst *inst;
  iterator __end1;
  iterator __begin1;
  StackIR *__range1;
  anon_class_8_1_0e8a2d5d note;
  StackIROptimizer *this_local;
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  *deferred;
  
  note.deferred._7_1_ = 0;
  std::
  unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>
  ::unordered_set(__return_storage_ptr__);
  this_00 = this->insts;
  __range1 = (StackIR *)__return_storage_ptr__;
  __end1 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::begin(this_00);
  inst = (StackInst *)
         std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
                                     *)&inst), bVar2) {
    ppSVar3 = __gnu_cxx::
              __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
              ::operator*(&__end1);
    pSVar1 = *ppSVar3;
    if (pSVar1 != (StackInst *)0x0) {
      pSVar4 = Expression::dynCast<wasm::StringWTF16Get>(pSVar1->origin);
      if (pSVar4 == (StringWTF16Get *)0x0) {
        pSVar5 = Expression::dynCast<wasm::StringSliceWTF>(pSVar1->origin);
        if (pSVar5 != (StringSliceWTF *)0x0) {
          findStringViewDeferredGets::anon_class_8_1_0e8a2d5d::operator()
                    ((anon_class_8_1_0e8a2d5d *)&__range1,pSVar5->start);
          findStringViewDeferredGets::anon_class_8_1_0e8a2d5d::operator()
                    ((anon_class_8_1_0e8a2d5d *)&__range1,pSVar5->end);
        }
      }
      else {
        findStringViewDeferredGets::anon_class_8_1_0e8a2d5d::operator()
                  ((anon_class_8_1_0e8a2d5d *)&__range1,pSVar4->pos);
      }
    }
    __gnu_cxx::
    __normal_iterator<wasm::StackInst_**,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::unordered_set<LocalGet*> StackIROptimizer::findStringViewDeferredGets() {
  std::unordered_set<LocalGet*> deferred;
  auto note = [&](Expression* e) {
    if (auto* get = e->dynCast<LocalGet>()) {
      deferred.insert(get);
    }
  };
  for (auto* inst : insts) {
    if (!inst) {
      continue;
    }
    if (auto* curr = inst->origin->dynCast<StringWTF16Get>()) {
      note(curr->pos);
    } else if (auto* curr = inst->origin->dynCast<StringSliceWTF>()) {
      note(curr->start);
      note(curr->end);
    }
  }
  return deferred;
}